

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O2

void __thiscall RefTable::Resize(RefTable *this,SQUnsignedInteger size)

{
  RefNode **p;
  SQUnsignedInteger SVar1;
  SQHash SVar2;
  RefNode *pRVar3;
  SQUnsignedInteger SVar4;
  SQUnsignedInteger SVar5;
  RefNode *obj;
  bool bVar6;
  
  p = this->_buckets;
  SVar1 = this->_numofslots;
  obj = this->_nodes;
  AllocNodes(this,size);
  SVar5 = 0;
  SVar4 = SVar1;
  do {
    bVar6 = SVar4 == 0;
    SVar4 = SVar4 - 1;
    if (bVar6) {
      if (SVar5 == SVar1) {
        sq_vm_free(p,SVar1 * 0x28);
        return;
      }
      __assert_fail("nfound == oldnumofslots",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqstate.cpp"
                    ,0x1e8,"void RefTable::Resize(SQUnsignedInteger)");
    }
    if ((obj->obj).super_SQObject._type != OT_NULL) {
      if (obj->refs == 0) {
        __assert_fail("t->refs != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqstate.cpp"
                      ,0x1e0,"void RefTable::Resize(SQUnsignedInteger)");
      }
      SVar2 = HashObj(&obj->obj);
      pRVar3 = Add(this,this->_numofslots - 1 & SVar2,(SQObject *)obj);
      pRVar3->refs = obj->refs;
      SQObjectPtr::Null(&obj->obj);
      SVar5 = SVar5 + 1;
    }
    obj = obj + 1;
  } while( true );
}

Assistant:

void RefTable::Resize(SQUnsignedInteger size)
{
    RefNode **oldbucks = _buckets;
    RefNode *t = _nodes;
    SQUnsignedInteger oldnumofslots = _numofslots;
    AllocNodes(size);
    //rehash
    SQUnsignedInteger nfound = 0;
    for(SQUnsignedInteger n = 0; n < oldnumofslots; n++) {
        if(type(t->obj) != OT_NULL) {
            //add back;
            assert(t->refs != 0);
            RefNode *nn = Add(::HashObj(t->obj)&(_numofslots-1),t->obj);
            nn->refs = t->refs;
            t->obj.Null();
            nfound++;
        }
        t++;
    }
    assert(nfound == oldnumofslots);
    SQ_FREE(oldbucks,(oldnumofslots * sizeof(RefNode *)) + (oldnumofslots * sizeof(RefNode)));
}